

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int seal_template_obj(JSContext *ctx,JSValue obj)

{
  JSShape *sh_00;
  uint uVar1;
  int iVar2;
  uint32_t *puVar3;
  JSShapeProperty *pJVar4;
  JSObject *in_RSI;
  JSContext *in_RDI;
  JSShapeProperty *prs;
  JSObject *p;
  intptr_t h;
  JSShapeProperty *prop;
  JSShapeProperty *pr;
  JSShape *sh;
  int local_3c;
  ulong local_38;
  JSShapeProperty *local_8;
  
  sh_00 = in_RSI->shape;
  uVar1 = sh_00->prop_hash_mask;
  puVar3 = prop_hash_end(sh_00);
  uVar1 = puVar3[-1 - (ulong)(uVar1 & 0x30)];
  pJVar4 = get_shape_prop(sh_00);
  while (local_38 = (ulong)uVar1, local_38 != 0) {
    local_8 = pJVar4 + (local_38 - 1);
    if (local_8->atom == 0x30) goto LAB_0019a4de;
    uVar1 = *(uint *)local_8 & 0x3ffffff;
  }
  local_8 = (JSShapeProperty *)0x0;
LAB_0019a4de:
  if ((local_8 == (JSShapeProperty *)0x0) ||
     (iVar2 = js_update_property_flags(in_RDI,in_RSI,(JSShapeProperty **)local_8,0), iVar2 == 0)) {
    (in_RSI->field_0).header.dummy1 = (in_RSI->field_0).header.dummy1 & 0xfe;
    local_3c = 0;
  }
  else {
    local_3c = -1;
  }
  return local_3c;
}

Assistant:

static int seal_template_obj(JSContext *ctx, JSValueConst obj)
{
    JSObject *p;
    JSShapeProperty *prs;

    p = JS_VALUE_GET_OBJ(obj);
    prs = find_own_property1(p, JS_ATOM_length);
    if (prs) {
        if (js_update_property_flags(ctx, p, &prs,
                                     prs->flags & ~(JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)))
            return -1;
    }
    p->extensible = FALSE;
    return 0;
}